

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O2

Matrix33 * AML::operator-(Matrix33 *__return_storage_ptr__,Matrix33 *lhs,double s)

{
  long lVar1;
  long lVar2;
  Matrix33 *pMVar3;
  Matrix33 *pMVar4;
  byte bVar5;
  Matrix33 local_60;
  
  bVar5 = 0;
  lVar2 = 9;
  pMVar3 = &local_60;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pMVar3->field_0).data[0][0] = (lhs->field_0).data[0][0];
    lhs = (Matrix33 *)((long)&lhs->field_0 + 8);
    pMVar3 = (Matrix33 *)((long)&pMVar3->field_0 + 8);
  }
  Matrix33::operator-=(&local_60,s);
  pMVar3 = &local_60;
  pMVar4 = __return_storage_ptr__;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pMVar4->field_0).data[0][0] = (pMVar3->field_0).data[0][0];
    pMVar3 = (Matrix33 *)((long)pMVar3 + (ulong)bVar5 * -0x10 + 8);
    pMVar4 = (Matrix33 *)((long)pMVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix33 operator-(const Matrix33& lhs, double s) { return (Matrix33(lhs) -= s); }